

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ssize_t sVar4;
  int *piVar5;
  ostream *poVar6;
  int iVar7;
  undefined1 local_218 [8];
  char buffer [256];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  int local_94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator<char> local_2a;
  char local_29 [8];
  char flag;
  
  do {
    sVar4 = read(this->read_fd_,local_29,1);
    iVar2 = (int)sVar4;
    if (iVar2 != -1) {
      if (iVar2 == 0) {
        this->outcome_ = DIED;
        goto LAB_00133366;
      }
      if (iVar2 == 1) {
        if (local_29[0] == 'I') {
          iVar2 = this->read_fd_;
          Message::Message((Message *)&local_90);
          goto LAB_0013349a;
        }
        if (local_29[0] == 'L') {
          this->outcome_ = LIVED;
        }
        else if (local_29[0] == 'T') {
          this->outcome_ = THREW;
        }
        else if (local_29[0] == 'R') {
          this->outcome_ = RETURNED;
        }
        else {
          GTestLog::GTestLog((GTestLog *)local_218,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                             ,499);
          poVar6 = std::operator<<((ostream *)&std::cerr,"Death test child process reported ");
          poVar6 = std::operator<<(poVar6,"unexpected status byte (");
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::operator<<(poVar6,")");
          GTestLog::~GTestLog((GTestLog *)local_218);
        }
        goto LAB_00133366;
      }
      break;
    }
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  GTestLog::GTestLog((GTestLog *)&local_50,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                     ,0x1f8);
  poVar6 = std::operator<<((ostream *)&std::cerr,"Read from death test child process failed: ");
  GetLastErrnoDescription_abi_cxx11_();
  std::operator<<(poVar6,(string *)local_218);
  std::__cxx11::string::~string((string *)local_218);
  GTestLog::~GTestLog((GTestLog *)&local_50);
  goto LAB_00133366;
  while( true ) {
    piVar5 = __errno_location();
    iVar7 = *piVar5;
    if (iVar7 != 4) break;
LAB_0013349a:
    while( true ) {
      sVar4 = read(iVar2,local_218,0xff);
      uVar3 = (uint)sVar4;
      if ((int)uVar3 < 1) break;
      local_218[uVar3 & 0x7fffffff] = 0;
      std::operator<<((ostream *)(local_90._M_dataplus._M_p + 0x10),local_218);
    }
    if (uVar3 != 0xffffffff) {
      if (uVar3 == 0) {
        GTestLog::GTestLog((GTestLog *)&local_70,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                           ,0x16f);
        Message::GetString_abi_cxx11_(&local_50,(Message *)&local_90);
        std::operator<<((ostream *)&std::cerr,(string *)&local_50);
        goto LAB_00133605;
      }
      piVar5 = __errno_location();
      iVar7 = *piVar5;
      break;
    }
  }
  GTestLog::GTestLog((GTestLog *)&local_70,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                     ,0x172);
  poVar6 = std::operator<<((ostream *)&std::cerr,"Error while reading death test internal: ");
  GetLastErrnoDescription_abi_cxx11_();
  poVar6 = std::operator<<(poVar6,(string *)&local_50);
  poVar6 = std::operator<<(poVar6," [");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar7);
  std::operator<<(poVar6,"]");
LAB_00133605:
  std::__cxx11::string::~string((string *)&local_50);
  GTestLog::~GTestLog((GTestLog *)&local_70);
  if ((long *)local_90._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_90._M_dataplus._M_p + 8))();
  }
LAB_00133366:
  do {
    while (iVar2 = close(this->read_fd_), iVar2 != -1) {
      bVar1 = AlwaysFalse();
      if (!bVar1) {
        this->read_fd_ = -1;
        return;
      }
    }
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"CHECK failed: File ",&local_2a);
  std::operator+(&local_f8,&local_d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (buffer + 0xf8),&local_f8,", line ");
  local_94 = 0x1fb;
  StreamableToString<int>(&local_b8,&local_94);
  std::operator+(&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (buffer + 0xf8),&local_b8);
  std::operator+(&local_90,&local_70,": ");
  std::operator+(&local_50,&local_90,"posix::Close(read_fd())");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                 &local_50," != -1");
  DeathTestAbort((string *)local_218);
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}